

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

double tsbp::MemoryUsedByCurrentProcess(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  double physicalMemoryUsedByCurrentProcess;
  char line [128];
  int result;
  FILE *file;
  
  __stream = fopen("/proc/self/status","r");
  line[0x7c] = -1;
  line[0x7d] = -1;
  line[0x7e] = -1;
  line[0x7f] = -1;
  do {
    pcVar2 = fgets((char *)&physicalMemoryUsedByCurrentProcess,0x80,__stream);
    if (pcVar2 == (char *)0x0) goto LAB_0013d304;
    iVar1 = strncmp((char *)&physicalMemoryUsedByCurrentProcess,"VmRSS:",6);
  } while (iVar1 != 0);
  line._124_4_ = parseLine((char *)&physicalMemoryUsedByCurrentProcess);
LAB_0013d304:
  fclose(__stream);
  return (double)(int)line._124_4_;
}

Assistant:

double MemoryUsedByCurrentProcess()
    {
        FILE* file = fopen("/proc/self/status", "r");
        int result = -1;
        char line[128];

        while (fgets(line, 128, file) != NULL){
            if (strncmp(line, "VmRSS:", 6) == 0){
                result = parseLine(line); // Note: this value is in KB!
                break;
            }
        }

        fclose(file);
        
        double physicalMemoryUsedByCurrentProcess = (double)result;

        return physicalMemoryUsedByCurrentProcess;
    }